

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

void libj1939_parse_canaddr(char *spec,sockaddr_can *paddr)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  ulonglong uVar4;
  char *local_10;
  
  local_10 = spec;
  pcVar2 = strsep(&local_10,":");
  if (*pcVar2 != '\0') {
    uVar1 = if_nametoindex(pcVar2);
    paddr->can_ifindex = uVar1;
  }
  pcVar2 = strsep(&local_10,",");
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    uVar3 = strtoul(pcVar2,(char **)0x0,0);
    (paddr->can_addr).j1939.addr = (__u8)uVar3;
  }
  pcVar2 = strsep(&local_10,",");
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    uVar3 = strtoul(pcVar2,(char **)0x0,0);
    (paddr->can_addr).j1939.pgn = (__u32)uVar3;
  }
  pcVar2 = strsep(&local_10,",");
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    uVar4 = strtoull(pcVar2,(char **)0x0,0);
    (paddr->can_addr).j1939.name = uVar4;
  }
  return;
}

Assistant:

void libj1939_parse_canaddr(char *spec, struct sockaddr_can *paddr)
{
	char *str;

	str = strsep(&spec, ":");
	if (strlen(str))
		paddr->can_ifindex = if_nametoindex(str);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.addr = strtoul(str, NULL, 0);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.pgn = strtoul(str, NULL, 0);

	str = strsep(&spec, ",");
	if (str && strlen(str))
		paddr->can_addr.j1939.name = strtoull(str, NULL, 0);
}